

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::~PosixSequentialFile(PosixSequentialFile *this)

{
  SequentialFile *in_RDI;
  
  close(*(int *)&in_RDI[1]._vptr_SequentialFile);
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  SequentialFile::~SequentialFile(in_RDI);
  return;
}

Assistant:

~PosixSequentialFile() override { close(fd_); }